

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

bool anon_unknown.dwarf_631b42::TestPresetExecutionShowOnlyHelper
               (ShowOnlyEnum *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String SStack_48;
  
  if ((value != (Value *)0x0) && (bVar1 = Json::Value::isString(value), bVar1)) {
    Json::Value::asString_abi_cxx11_(&SStack_48,value);
    bVar1 = std::operator==(&SStack_48,"human");
    std::__cxx11::string::~string((string *)&SStack_48);
    if (bVar1) {
      *out = Human;
    }
    else {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"json-v1");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (!bVar1) goto LAB_0023ee49;
      *out = JsonV1;
    }
    return true;
  }
LAB_0023ee49:
  cmCMakePresetsErrors::INVALID_PRESET(value,state);
  return false;
}

Assistant:

bool TestPresetExecutionShowOnlyHelper(
  TestPreset::ExecutionOptions::ShowOnlyEnum& out, const Json::Value* value,
  cmJSONState* state)
{
  if (!value || !value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "human") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::Human;
    return true;
  }

  if (value->asString() == "json-v1") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::JsonV1;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}